

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall ftxui::Node::Check(Node *this,Status *status)

{
  bool bVar1;
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<ftxui::Node> *child;
  iterator __end1;
  iterator __begin1;
  Elements *__range1;
  Status *status_local;
  Node *this_local;
  
  __end1 = std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ::begin(&this->children_);
  child = (shared_ptr<ftxui::Node> *)
          std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
          ::end(&this->children_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
                                *)&child);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_Node[5])(peVar2,status);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ftxui::Node>_*,_std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>_>
    ::operator++(&__end1);
  }
  status->need_iteration = (status->need_iteration & 1U) != 0 || status->iteration == 0;
  return;
}

Assistant:

void Node::Check(Status* status) {
  for (auto& child : children_) {
    child->Check(status);
  }
  status->need_iteration |= (status->iteration == 0);
}